

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::detail::ResultBuilder::binary_assert<0,supermap::Key<4ul>,supermap::Key<4ul>>
          (ResultBuilder *this,Key<4UL> *lhs,Key<4UL> *rhs)

{
  ContextOptions *pCVar1;
  Key<4UL> *in_R8;
  bool bVar2;
  String SStack_38;
  
  bVar2 = *(int *)(lhs->super_array<unsigned_char,_4UL>)._M_elems !=
          *(int *)(rhs->super_array<unsigned_char,_4UL>)._M_elems;
  (this->super_AssertData).m_failed = bVar2;
  if ((!bVar2) && (pCVar1 = getContextOptions(), pCVar1->success != true)) {
    return;
  }
  stringifyBinaryExpr<supermap::Key<4ul>,supermap::Key<4ul>>
            (&SStack_38,(detail *)lhs,(Key<4UL> *)0x1be8fa,(char *)rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }